

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O1

void test20(char *infile,char *password,char *outfile,char *xarg)

{
  qpdf_read(qpdf,infile,password);
  qpdf_init_write(qpdf,outfile);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_static_aes_IV(qpdf,1);
  qpdf_set_compress_streams(qpdf,0);
  qpdf_set_decode_level(qpdf,2);
  qpdf_write(qpdf);
  report_errors();
  return;
}

Assistant:

static void
test20(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_read(qpdf, infile, password);
    qpdf_init_write(qpdf, outfile);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_static_aes_IV(qpdf, QPDF_TRUE);
    qpdf_set_compress_streams(qpdf, QPDF_FALSE);
    qpdf_set_decode_level(qpdf, qpdf_dl_specialized);
    qpdf_write(qpdf);
    report_errors();
}